

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::ImplicitProducer
          (ImplicitProducer *this,ConcurrentQueue<_zframe_t_*,_MyTraits> *parent)

{
  (this->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next =
       (ConcurrentQueueProducerTypelessBase *)0x0;
  (this->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.inactive._M_base._M_i = false
  ;
  (this->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.token = (ProducerToken *)0x0;
  (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).dequeueOptimisticCount.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   ((long)&(this->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i + 1)
       = 0;
  *(undefined8 *)((long)&(this->super_ProducerBase).tailBlock + 1) = 0;
  (this->super_ProducerBase).parent = parent;
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_0043acb0;
  this->nextBlockIndexCapacity = 0x20;
  (this->blockIndex)._M_b._M_p = (__pointer_type)0x0;
  new_block_index(this);
  return;
}

Assistant:

ConcurrentQueueProducerTypelessBase()
			: next(nullptr), inactive(false), token(nullptr)
		{
		}